

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ds_format.hpp
# Opt level: O0

void __thiscall DSFormat::DSFormat(DSFormat *this,VSFormat *format)

{
  bool local_19;
  VSFormat *format_local;
  DSFormat *this_local;
  
  this->IsFamilyYUV = true;
  this->IsFamilyRGB = false;
  this->IsFamilyYCC = false;
  this->IsInteger = true;
  this->IsFloat = false;
  this->SSW = 0;
  this->SSH = 0;
  this->BitsPerSample = 8;
  this->BytesPerSample = 1;
  this->Planes = 3;
  this->Planes = format->numPlanes;
  local_19 = true;
  if (format->colorFamily != 3000000) {
    local_19 = format->colorFamily == 1000000;
  }
  this->IsFamilyYUV = local_19;
  this->IsFamilyRGB = format->colorFamily == 2000000;
  this->IsFamilyYCC = format->colorFamily == 4000000;
  this->SSW = format->subSamplingW;
  this->SSH = format->subSamplingH;
  this->BitsPerSample = format->bitsPerSample;
  this->BytesPerSample = format->bytesPerSample;
  this->IsInteger = format->sampleType == 0;
  this->IsFloat = format->sampleType == 1;
  return;
}

Assistant:

DSFormat(const VSFormat* format)
  {
    Planes = format->numPlanes;
    IsFamilyYUV = format->colorFamily == cmYUV || format->colorFamily == cmGray;
    IsFamilyRGB = format->colorFamily == cmRGB;
    IsFamilyYCC = format->colorFamily == cmYCoCg;
    SSW = format->subSamplingW;
    SSH = format->subSamplingH;
    BitsPerSample = format->bitsPerSample;
    BytesPerSample = format->bytesPerSample;
    IsInteger = format->sampleType == stInteger;
    IsFloat = format->sampleType == stFloat;
  }